

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int viewCallback(void *NotUsed,int argc,char **argv,char **azColName)

{
  char **ppcVar1;
  size_t sVar2;
  char *__format;
  int iVar3;
  char tmp_str [64];
  
  tmp_str[0x30] = '\0';
  tmp_str[0x31] = '\0';
  tmp_str[0x32] = '\0';
  tmp_str[0x33] = '\0';
  tmp_str[0x34] = '\0';
  tmp_str[0x35] = '\0';
  tmp_str[0x36] = '\0';
  tmp_str[0x37] = '\0';
  tmp_str[0x38] = '\0';
  tmp_str[0x39] = '\0';
  tmp_str[0x3a] = '\0';
  tmp_str[0x3b] = '\0';
  tmp_str[0x3c] = '\0';
  tmp_str[0x3d] = '\0';
  tmp_str[0x3e] = '\0';
  tmp_str[0x3f] = '\0';
  tmp_str[0x20] = '\0';
  tmp_str[0x21] = '\0';
  tmp_str[0x22] = '\0';
  tmp_str[0x23] = '\0';
  tmp_str[0x24] = '\0';
  tmp_str[0x25] = '\0';
  tmp_str[0x26] = '\0';
  tmp_str[0x27] = '\0';
  tmp_str[0x28] = '\0';
  tmp_str[0x29] = '\0';
  tmp_str[0x2a] = '\0';
  tmp_str[0x2b] = '\0';
  tmp_str[0x2c] = '\0';
  tmp_str[0x2d] = '\0';
  tmp_str[0x2e] = '\0';
  tmp_str[0x2f] = '\0';
  tmp_str[0x10] = '\0';
  tmp_str[0x11] = '\0';
  tmp_str[0x12] = '\0';
  tmp_str[0x13] = '\0';
  tmp_str[0x14] = '\0';
  tmp_str[0x15] = '\0';
  tmp_str[0x16] = '\0';
  tmp_str[0x17] = '\0';
  tmp_str[0x18] = '\0';
  tmp_str[0x19] = '\0';
  tmp_str[0x1a] = '\0';
  tmp_str[0x1b] = '\0';
  tmp_str[0x1c] = '\0';
  tmp_str[0x1d] = '\0';
  tmp_str[0x1e] = '\0';
  tmp_str[0x1f] = '\0';
  tmp_str[0] = '\0';
  tmp_str[1] = '\0';
  tmp_str[2] = '\0';
  tmp_str[3] = '\0';
  tmp_str[4] = '\0';
  tmp_str[5] = '\0';
  tmp_str[6] = '\0';
  tmp_str[7] = '\0';
  tmp_str[8] = '\0';
  tmp_str[9] = '\0';
  tmp_str[10] = '\0';
  tmp_str[0xb] = '\0';
  tmp_str[0xc] = '\0';
  tmp_str[0xd] = '\0';
  tmp_str[0xe] = '\0';
  tmp_str[0xf] = '\0';
  if (argc < 1) {
    argc = 0;
  }
  iVar3 = 0;
  do {
    if (argc == iVar3) {
      sVar2 = strlen(query_result_g);
      (query_result_g + sVar2)[0] = '\n';
      (query_result_g + sVar2)[1] = '\0';
      return 0;
    }
    __format = "%s   ";
    ppcVar1 = argv;
    if (iVar3 == 0) {
LAB_00104301:
      snprintf(tmp_str,0x40,__format,*ppcVar1);
    }
    else {
      if (iVar3 == 2) {
        __format = "%s";
        ppcVar1 = argv + 2;
        goto LAB_00104301;
      }
      if (iVar3 == 1) {
        __format = "%s     ";
        ppcVar1 = argv + 1;
        goto LAB_00104301;
      }
    }
    strcat(query_result_g,tmp_str);
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

int 
viewCallback (void* NotUsed, int argc, char** argv, char** azColName) 
{
    /*  Format of returned string:
     *  18/06/2020, room 21, reserve code: 8GT4A
     */


    // query_result_g is the payload "to be returned". 
    // query_result_g is a global variable!

    // clean payload right before filling if from scratch.
    // memset(query_result_g, '\0', sizeof(query_result_g));

    
    char tmp_str[64];
    memset(tmp_str, '\0', sizeof(tmp_str));


    for (int i = 0; i < argc; i++)
    {
        if (i==0){
            snprintf(tmp_str, sizeof(tmp_str), "%s   ", argv[i]);
        }
        else if (i == 1){
            snprintf(tmp_str, sizeof(tmp_str), "%s     ", argv[i]);   
        }
        else if (i == 2){
            snprintf(tmp_str, sizeof(tmp_str), "%s", argv[i]);   
        }
        strcat(query_result_g, tmp_str);

    }
    
    strcat(query_result_g, "\n");
        

    return 0;
}